

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

cmList * __thiscall
cmList::GetItems(cmList *__return_storage_ptr__,cmList *this,
                vector<long,_std::allocator<long>_> *indexes)

{
  bool bVar1;
  reference plVar2;
  const_reference args;
  long index;
  iterator __end1;
  iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  vector<long,_std::allocator<long>_> *indexes_local;
  cmList *this_local;
  cmList *listItems;
  
  cmList(__return_storage_ptr__);
  __end1 = std::vector<long,_std::allocator<long>_>::begin(indexes);
  index = (long)std::vector<long,_std::allocator<long>_>::end(indexes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                     *)&index), bVar1) {
    plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end1);
    args = get_item_abi_cxx11_(this,*plVar2);
    emplace_back<std::__cxx11::string_const&>(__return_storage_ptr__,args);
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmList cmList::GetItems(std::vector<index_type>&& indexes) const
{
  cmList listItems;

  for (auto index : indexes) {
    listItems.emplace_back(this->get_item(index));
  }

  return listItems;
}